

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window.c
# Opt level: O2

void glfwShowWindow(GLFWwindow *handle)

{
  if (handle == (GLFWwindow *)0x0) {
    __assert_fail("window != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_1510/jeertmans[P]DelaunayTriangulation/deps/BOV/deps/glfw/src/window.c"
                  ,0x2fd,"void glfwShowWindow(GLFWwindow *)");
  }
  if (_glfw.initialized != 0) {
    if (*(long *)(handle + 0x48) == 0) {
      _glfwPlatformShowWindow((_GLFWwindow *)handle);
      if (*(int *)(handle + 0x18) != 0) {
        _glfwPlatformFocusWindow((_GLFWwindow *)handle);
        return;
      }
    }
    return;
  }
  _glfwInputError(0x10001,(char *)0x0);
  return;
}

Assistant:

GLFWAPI void glfwShowWindow(GLFWwindow* handle)
{
    _GLFWwindow* window = (_GLFWwindow*) handle;
    assert(window != NULL);

    _GLFW_REQUIRE_INIT();

    if (window->monitor)
        return;

    _glfwPlatformShowWindow(window);

    if (window->focusOnShow)
        _glfwPlatformFocusWindow(window);
}